

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.c
# Opt level: O1

bool_t memTest(void)

{
  char *pcVar1;
  char *dest;
  bool_t bVar2;
  int iVar3;
  void *buf_00;
  void *pvVar4;
  long lVar5;
  size_t sVar6;
  octet buf [16];
  octet buf1 [16];
  octet buf2 [16];
  undefined8 uStack_60;
  char local_58 [16];
  char local_48 [16];
  undefined1 local_38 [8];
  char local_30;
  
  uStack_60 = 0x103e55;
  memSet(local_58,'\0',0x10);
  uStack_60 = 0x103e62;
  bVar2 = memIsValid(local_58,0x10);
  if (bVar2 != 0) {
    uStack_60 = 0x103e75;
    bVar2 = memIsValid((void *)0x0,0);
    if (bVar2 != 0) {
      uStack_60 = 0x103e87;
      buf_00 = memAlloc(100);
      if (buf_00 != (void *)0x0) {
        uStack_60 = 0x103ea5;
        memSet(buf_00,'\a',100);
        uStack_60 = 0x103eb2;
        pvVar4 = memRealloc(buf_00,0x66);
        if (pvVar4 != (void *)0x0) {
          uStack_60 = 0x103ed0;
          bVar2 = memIsRep(pvVar4,100,'\a');
          buf_00 = pvVar4;
          if (bVar2 != 0) {
            uStack_60 = 0x103ee5;
            pvVar4 = memRealloc(pvVar4,0x5a);
            if (pvVar4 != (void *)0x0) {
              uStack_60 = 0x103f06;
              bVar2 = memIsRep(pvVar4,0x5a,'\a');
              buf_00 = pvVar4;
              if (bVar2 != 0) {
                uStack_60 = 0x103f18;
                buf_00 = memRealloc(pvVar4,0);
                if (buf_00 == (void *)0x0) {
                  uStack_60 = 0x103f2d;
                  memFree((void *)0x0);
                  uStack_60 = 0x103f42;
                  memSet(local_58,'\f',0x10);
                  uStack_60 = 0x103f54;
                  memCopy(local_48,local_58,0x10);
                  lVar5 = 0;
                  do {
                    if (local_48[lVar5] != local_58[lVar5]) {
                      return 0;
                    }
                    local_48[lVar5] = (char)lVar5;
                    local_58[lVar5] = (char)lVar5;
                    lVar5 = lVar5 + 1;
                  } while (lVar5 != 0x10);
                  pcVar1 = local_58 + 1;
                  uStack_60 = 0x103f88;
                  memMove(local_58,pcVar1,0xf);
                  dest = local_48 + 1;
                  uStack_60 = 0x103f9f;
                  memMove(dest,local_48,0xf);
                  lVar5 = 2;
                  do {
                    if (local_48[lVar5] != local_58[lVar5 + -2]) {
                      return 0;
                    }
                    lVar5 = lVar5 + 1;
                  } while (lVar5 != 0x10);
                  uStack_60 = 0x103fce;
                  memCopy(local_48,(void *)0x0,0);
                  uStack_60 = 0x103fda;
                  memMove(local_48,(void *)0x0,0);
                  uStack_60 = 0x103fec;
                  hexTo(local_58,"000102030405060708090A0B0C0D0E0F");
                  uStack_60 = 0x103ffb;
                  hexTo(local_48,"F00102030405060708090A0B0C0D0EFF");
                  uStack_60 = 0x104008;
                  bVar2 = memIsZero(local_58,0xf);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x10401d;
                  bVar2 = memIsZero_fast(local_58,0xf);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104032;
                  bVar2 = memIsZero_fast(local_58,3);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x10404a;
                  bVar2 = memEq(pcVar1,dest,0xf);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104062;
                  bVar2 = memEq_fast(pcVar1,dest,0xf);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104084;
                  bVar2 = memEq(local_58 + 8,local_48 + 8,8);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x10409c;
                  bVar2 = memEq_fast(local_58 + 8,local_48 + 8,8);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1040b4;
                  bVar2 = memEq(pcVar1,dest,8);
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1040cc;
                  bVar2 = memEq_fast(pcVar1,dest,8);
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1040e4;
                  bVar2 = memEq(pcVar1,dest,0xe);
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1040fc;
                  bVar2 = memEq_fast(pcVar1,dest,0xe);
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104116;
                  iVar3 = memCmp(local_58,local_48,7);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104131;
                  iVar3 = memCmp_fast(local_58,local_48,7);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10414c;
                  iVar3 = memCmpRev(local_58,local_48,7);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104167;
                  iVar3 = memCmpRev_fast(local_58,local_48,7);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104182;
                  iVar3 = memCmp(local_58,local_48,0xf);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10419d;
                  iVar3 = memCmp_fast(local_58,local_48,0xf);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1041b8;
                  iVar3 = memCmpRev(local_58,local_48,0xf);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1041d3;
                  iVar3 = memCmpRev_fast(local_58,local_48,0xf);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1041ee;
                  iVar3 = memCmp(local_48,local_58,0xf);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104209;
                  iVar3 = memCmp_fast(local_48,local_58,0xf);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104224;
                  iVar3 = memCmpRev(local_48,local_58,0xf);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10423f;
                  iVar3 = memCmpRev_fast(local_48,local_58,0xf);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10425a;
                  iVar3 = memCmp(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104275;
                  iVar3 = memCmp_fast(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104290;
                  iVar3 = memCmpRev(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1042ab;
                  iVar3 = memCmpRev_fast(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1042c6;
                  iVar3 = memCmp(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1042e1;
                  iVar3 = memCmp_fast(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1042fc;
                  iVar3 = memCmpRev(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104317;
                  iVar3 = memCmpRev_fast(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104330;
                  iVar3 = memCmp(pcVar1,dest,8);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104348;
                  iVar3 = memCmp_fast(pcVar1,dest,8);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104360;
                  iVar3 = memCmp(pcVar1,dest,0xe);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104378;
                  iVar3 = memCmp_fast(pcVar1,dest,0xe);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104390;
                  iVar3 = memCmpRev(pcVar1,dest,8);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1043a8;
                  iVar3 = memCmpRev_fast(pcVar1,dest,8);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1043c0;
                  iVar3 = memCmpRev(pcVar1,dest,0xe);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1043d8;
                  iVar3 = memCmpRev_fast(pcVar1,dest,0xe);
                  if (iVar3 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1043f0;
                  memRev(local_58,0xf);
                  uStack_60 = 0x1043fd;
                  sVar6 = memNonZeroSize(local_58,0xf);
                  if (sVar6 != 0xe) {
                    return 0;
                  }
                  uStack_60 = 0x104419;
                  hexTo(local_58,"F001020304050607");
                  uStack_60 = 0x10442d;
                  hexTo(local_48,"00010203040506F7");
                  uStack_60 = 0x10443d;
                  iVar3 = memCmp(local_58,local_48,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104458;
                  iVar3 = memCmp_fast(local_58,local_48,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104473;
                  iVar3 = memCmp(local_48,local_58,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10448e;
                  iVar3 = memCmp_fast(local_48,local_58,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1044a9;
                  iVar3 = memCmpRev(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1044c4;
                  iVar3 = memCmpRev_fast(local_58,local_48,8);
                  if (iVar3 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1044df;
                  iVar3 = memCmpRev(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1044fa;
                  iVar3 = memCmpRev_fast(local_48,local_58,8);
                  if (iVar3 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104515;
                  hexTo(local_58,"01010101010101010102");
                  uStack_60 = 0x104527;
                  bVar2 = memIsRep(local_58,7,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104542;
                  bVar2 = memIsRep_fast(local_58,7,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10455d;
                  bVar2 = memIsRep(local_58,8,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104578;
                  bVar2 = memIsRep_fast(local_58,8,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104593;
                  bVar2 = memIsRep(local_58,9,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1045ae;
                  bVar2 = memIsRep_fast(local_58,9,'\x01');
                  if (bVar2 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1045c9;
                  bVar2 = memIsRep(local_58,10,'\x01');
                  if (bVar2 == 1) {
                    return 0;
                  }
                  uStack_60 = 0x1045e4;
                  bVar2 = memIsRep_fast(local_58,10,'\x01');
                  if (bVar2 == 1) {
                    return 0;
                  }
                  uStack_60 = 0x1045ff;
                  hexTo(local_58,"0001020304050607");
                  uStack_60 = 0x10461d;
                  memJoin(local_58,pcVar1,3,local_58 + 3,4);
                  uStack_60 = 0x10462c;
                  bVar2 = hexEq(local_58,"01020303040506");
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104646;
                  hexTo(local_58,"0001020304050607");
                  uStack_60 = 0x10465f;
                  memJoin(local_58,pcVar1,3,pcVar1,4);
                  uStack_60 = 0x10466e;
                  bVar2 = hexEq(local_58,"01020301020304");
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104688;
                  hexTo(local_58,"0001020304050607");
                  pcVar1 = local_58 + 2;
                  uStack_60 = 0x1046a6;
                  memJoin(local_58,local_58 + 3,4,pcVar1,2);
                  uStack_60 = 0x1046b5;
                  bVar2 = hexEq(local_58,"030405060203");
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1046cf;
                  hexTo(local_58,"0001020304050607");
                  uStack_60 = 0x1046ea;
                  memJoin(pcVar1,local_58,4,local_58 + 4,2);
                  uStack_60 = 0x1046f9;
                  bVar2 = hexEq(pcVar1,"000102030405");
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104713;
                  hexTo(local_58,"000102030405060708");
                  uStack_60 = 0x104727;
                  hexTo(local_48,"F0F1F2F3F4F5F6F7F8");
                  uStack_60 = 0x10473f;
                  memXor(local_38,local_58,local_48,9);
                  uStack_60 = 0x104751;
                  bVar2 = memIsRep(local_38,9,0xf0);
                  if (bVar2 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x10476c;
                  memXor2(local_38,local_48,9);
                  uStack_60 = 0x10477c;
                  memXor2(local_38,local_58,8);
                  uStack_60 = 0x10478b;
                  bVar2 = memIsRep(local_38,8,'\0');
                  return (uint)(local_30 == '\b' && bVar2 != 0);
                }
              }
            }
          }
        }
        uStack_60 = 0x1047ae;
        memFree(buf_00);
      }
    }
  }
  return 0;
}

Assistant:

bool_t memTest()
{
	octet buf[16];
	octet buf1[16];
	octet buf2[16];
	void* p;
	void* p1;
	size_t i;
	// pre
	CASSERT(sizeof(buf) == sizeof(buf1));
	memSetZero(buf, sizeof(buf));
	if (!memIsValid(buf, sizeof(buf)) || !memIsValid(0, 0))
		return FALSE;
	// alloc (считаем, что памяти хватает)
	p = memAlloc(100);
	if (!p)
		return FALSE;
	memSet(p, 7, 100);
	if (!(p1 = memRealloc(p, 102)) || 
		!memIsRep(p = p1, 100, 7) ||
		!(p1 = memRealloc(p, 90)) || 
		!memIsRep(p = p1, 90, 7) ||
		(p = memRealloc(p, 0)))
	{
		memFree(p);
		return FALSE;
	}
	memFree(p);
	// заполнение / копирование
	memSet(buf, 12, sizeof(buf));
	memCopy(buf1, buf, sizeof(buf));
	for (i = 0; i < sizeof(buf); ++i)
	{
		if (buf1[i] != buf[i])
			return FALSE;
		buf[i] = buf1[i] = i % 256u;
	}
	memMove(buf, buf + 1, sizeof(buf) - 1);
	memMove(buf1 + 1, buf1, sizeof(buf1) - 1);
	for (i = 0; i < sizeof(buf) - 2; ++i)
	{
		if (buf1[i + 2] != buf[i])
			return FALSE;
	}
	memCopy(buf1, 0, 0);
	memMove(buf1, 0, 0);
	// сравнение
	hexTo(buf,  "000102030405060708090A0B0C0D0E0F");
	hexTo(buf1, "F00102030405060708090A0B0C0D0EFF");
	if (SAFE(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 3) ||
		SAFE(memEq)(buf + 1, buf1 + 1, 15) ||
		FAST(memEq)(buf + 1, buf1 + 1, 15) ||
		SAFE(memEq)(buf + 8, buf1 + 8, 8) ||
		FAST(memEq)(buf + 8, buf1 + 8, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 8) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 14) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 14) ||
		SAFE(memCmp)(buf, buf1, 7) != -1 ||
		FAST(memCmp)(buf, buf1, 7) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 7) != -1 ||
		FAST(memCmpRev)(buf, buf1, 7) != -1 ||
		SAFE(memCmp)(buf, buf1, 15) != -1 ||
		FAST(memCmp)(buf, buf1, 15) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 15) != -1 ||
		FAST(memCmpRev)(buf, buf1, 15) != -1 ||
		SAFE(memCmp)(buf1, buf, 15) != 1 ||
		FAST(memCmp)(buf1, buf, 15) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 15) != 1 ||
		FAST(memCmpRev)(buf1, buf, 15) != 1 ||
		SAFE(memCmp)(buf, buf1, 8) != -1 ||
		FAST(memCmp)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmp)(buf1, buf, 8) != 1 ||
		FAST(memCmp)(buf1, buf, 8) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 14) != 0)
		return FALSE;
	memRev(buf, 15);
	if (memNonZeroSize(buf, 15) != 14)
		return FALSE;
	hexTo(buf,  "F001020304050607");
	hexTo(buf1, "00010203040506F7");
	if (SAFE(memCmp)(buf, buf1, 8) != 1 ||
		FAST(memCmp)(buf, buf1, 8) != 1 ||
		SAFE(memCmp)(buf1, buf, 8) != -1 ||
		FAST(memCmp)(buf1, buf, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1)
		return FALSE;
	hexTo(buf, "01010101010101010102");
	if (SAFE(memIsRep)(buf, 7, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 7, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 8, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 8, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 9, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 9, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 10, 0x01) == TRUE ||
		FAST(memIsRep)(buf, 10, 0x01) == TRUE)
		return FALSE;
	// join
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 3, 4);
	if (!hexEq(buf, "01020303040506"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 1, 4);
	if (!hexEq(buf, "01020301020304"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 3, 4, buf + 2, 2);
	if (!hexEq(buf, "030405060203"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf + 2, buf, 4, buf + 4, 2);
	if (!hexEq(buf + 2, "000102030405"))
		return FALSE;
	// xor
	hexTo(buf, "000102030405060708");
	hexTo(buf1, "F0F1F2F3F4F5F6F7F8");
	memXor(buf2, buf, buf1, 9);
	if (!memIsRep(buf2, 9, 0xF0))
		return FALSE;
	memXor2(buf2, buf1, 9);
	memXor2(buf2, buf, 8);
	if (!memIsRep(buf2, 8, 0) || buf2[8] != 0x08)
		return FALSE;
	// все нормально
	return TRUE;
}